

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdh.c
# Opt level: O1

int mbedtls_ecdh_get_params
              (mbedtls_ecdh_context *ctx,mbedtls_ecp_keypair *key,mbedtls_ecdh_side side)

{
  mbedtls_ecp_group_id grp_id;
  int iVar1;
  int iVar2;
  
  iVar2 = -0x4f80;
  if (side < 2) {
    grp_id = (key->grp).id;
    if (ctx->grp_id == MBEDTLS_ECP_DP_NONE) {
      iVar1 = mbedtls_ecdh_setup(ctx,grp_id);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    else if (ctx->grp_id != grp_id) {
      return -0x4f80;
    }
    if (ctx->var == MBEDTLS_ECDH_VARIANT_MBEDTLS_2_0) {
      if ((side & MBEDTLS_ECDH_THEIRS) != MBEDTLS_ECDH_OURS) {
        iVar2 = mbedtls_ecp_copy(&(ctx->ctx).mbed_ecdh.Qp,&key->Q);
        return iVar2;
      }
      iVar2 = mbedtls_ecp_copy(&(ctx->ctx).mbed_ecdh.Q,&key->Q);
      if (iVar2 == 0) {
        iVar2 = mbedtls_mpi_copy(&(ctx->ctx).mbed_ecdh.d,&key->d);
        return iVar2;
      }
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_ecdh_get_params(mbedtls_ecdh_context *ctx,
                            const mbedtls_ecp_keypair *key,
                            mbedtls_ecdh_side side)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    if (side != MBEDTLS_ECDH_OURS && side != MBEDTLS_ECDH_THEIRS) {
        return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
    }

    if (mbedtls_ecdh_grp_id(ctx) == MBEDTLS_ECP_DP_NONE) {
        /* This is the first call to get_params(). Set up the context
         * for use with the group. */
        if ((ret = mbedtls_ecdh_setup(ctx, key->grp.id)) != 0) {
            return ret;
        }
    } else {
        /* This is not the first call to get_params(). Check that the
         * current key's group is the same as the context's, which was set
         * from the first key's group. */
        if (mbedtls_ecdh_grp_id(ctx) != key->grp.id) {
            return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
        }
    }

#if defined(MBEDTLS_ECDH_LEGACY_CONTEXT)
    return ecdh_get_params_internal(ctx, key, side);
#else
    switch (ctx->var) {
#if defined(MBEDTLS_ECDH_VARIANT_EVEREST_ENABLED)
        case MBEDTLS_ECDH_VARIANT_EVEREST:
        {
            mbedtls_everest_ecdh_side s = side == MBEDTLS_ECDH_OURS ?
                                          MBEDTLS_EVEREST_ECDH_OURS :
                                          MBEDTLS_EVEREST_ECDH_THEIRS;
            return mbedtls_everest_get_params(&ctx->ctx.everest_ecdh,
                                              key, s);
        }
#endif
        case MBEDTLS_ECDH_VARIANT_MBEDTLS_2_0:
            return ecdh_get_params_internal(&ctx->ctx.mbed_ecdh,
                                            key, side);
        default:
            return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
    }
#endif
}